

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int rc_pick_q_and_bounds_q_mode
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_COMMON *cm_00;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  int *in_R8;
  int *in_R9;
  int q;
  int active_worst_quality;
  int active_best_quality;
  int cq_level;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_50;
  int in_stack_ffffffffffffffe8;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  lVar1 = *in_RDI;
  iVar2 = frame_is_intra_only(cm_00);
  iVar3 = get_active_cq_level((RATE_CONTROL *)(in_RDI + 0xc0ee),
                              (PRIMARY_RATE_CONTROL *)(lVar1 + 0x8b30),
                              (AV1EncoderConfig *)(in_RDI + 0x8464),iVar2,
                              *(aom_superres_mode *)(in_RDI + 0x13a99),
                              (uint)*(byte *)(in_RDI + 0x77fa));
  local_50 = 0;
  iVar2 = *(int *)((long)in_RDI + 0x60844);
  iVar4 = frame_is_intra_only(cm_00);
  if (iVar4 == 0) {
    local_50 = get_active_best_quality
                         ((AV1_COMP *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_R8 >> 0x20),(int)in_R8,(int)((ulong)in_R9 >> 0x20));
  }
  else {
    get_intra_q_and_bounds
              ((AV1_COMP *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,in_R8,in_R9,
               (int)((ulong)cm_00 >> 0x20));
  }
  if (0 < iVar3) {
    if (local_50 < 1) {
      local_74 = 1;
    }
    else {
      local_74 = local_50;
    }
    local_50 = local_74;
  }
  *in_R9 = iVar2;
  *in_R8 = local_50;
  if ((int)in_RDI[0xc106] < *in_R9) {
    local_78 = *in_R9;
  }
  else {
    local_78 = (int)in_RDI[0xc106];
  }
  *in_R9 = local_78;
  if (*in_R9 < *(int *)((long)in_RDI + 0x6082c)) {
    local_7c = *in_R9;
  }
  else {
    local_7c = *(int *)((long)in_RDI + 0x6082c);
  }
  *in_R9 = local_7c;
  if ((int)in_RDI[0xc106] < *in_R8) {
    local_80 = *in_R8;
  }
  else {
    local_80 = (int)in_RDI[0xc106];
  }
  *in_R8 = local_80;
  if (*in_R8 < *(int *)((long)in_RDI + 0x6082c)) {
    local_84 = *in_R8;
  }
  else {
    local_84 = *(int *)((long)in_RDI + 0x6082c);
  }
  *in_R8 = local_84;
  if ((int)in_RDI[0xc106] < local_50) {
    local_88 = local_50;
  }
  else {
    local_88 = (int)in_RDI[0xc106];
  }
  if (local_88 < *(int *)((long)in_RDI + 0x6082c)) {
    local_8c = local_88;
  }
  else {
    local_8c = *(int *)((long)in_RDI + 0x6082c);
  }
  return local_8c;
}

Assistant:

static int rc_pick_q_and_bounds_q_mode(const AV1_COMP *cpi, int width,
                                       int height, int gf_index,
                                       int *bottom_index, int *top_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const int cq_level =
      get_active_cq_level(rc, p_rc, oxcf, frame_is_intra_only(cm),
                          cpi->superres_mode, cm->superres_scale_denominator);
  int active_best_quality = 0;
  int active_worst_quality = rc->active_worst_quality;
  int q;

  if (frame_is_intra_only(cm)) {
    get_intra_q_and_bounds(cpi, width, height, &active_best_quality,
                           &active_worst_quality, cq_level);
  } else {
    //  Active best quality limited by previous layer.
    active_best_quality =
        get_active_best_quality(cpi, active_worst_quality, cq_level, gf_index);
  }

  if (cq_level > 0) active_best_quality = AOMMAX(1, active_best_quality);

  *top_index = active_worst_quality;
  *bottom_index = active_best_quality;

  *top_index = AOMMAX(*top_index, rc->best_quality);
  *top_index = AOMMIN(*top_index, rc->worst_quality);

  *bottom_index = AOMMAX(*bottom_index, rc->best_quality);
  *bottom_index = AOMMIN(*bottom_index, rc->worst_quality);

  q = active_best_quality;

  q = AOMMAX(q, rc->best_quality);
  q = AOMMIN(q, rc->worst_quality);

  assert(*top_index <= rc->worst_quality && *top_index >= rc->best_quality);
  assert(*bottom_index <= rc->worst_quality &&
         *bottom_index >= rc->best_quality);
  assert(q <= rc->worst_quality && q >= rc->best_quality);

  return q;
}